

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astcenc_block_sizes.cpp
# Opt level: O2

void assign_kmeans_texels(block_size_descriptor *bsd)

{
  byte bVar2;
  int iVar1;
  uint8_t i;
  ulong uVar3;
  uint uVar4;
  uint64_t rng_state [2];
  bool seen [216];
  astc aaStack_108 [16];
  char acStack_f8 [224];
  
  bVar2 = bsd->texel_count;
  if ((ulong)bVar2 < 0x41) {
    for (uVar3 = 0; bVar2 != uVar3; uVar3 = uVar3 + 1) {
      bsd->kmeans_texels[uVar3] = (uint8_t)uVar3;
    }
  }
  else {
    astc::rand_init((uint64_t *)aaStack_108);
    bVar2 = bsd->texel_count;
    for (uVar3 = 0; bVar2 != uVar3; uVar3 = uVar3 + 1) {
      acStack_f8[uVar3] = '\0';
    }
    uVar4 = 0;
    while (uVar4 < 0x40) {
      iVar1 = astc::rand(aaStack_108);
      bVar2 = (byte)(((ushort)iVar1 & 0xff) % (ushort)bsd->texel_count);
      if (acStack_f8[bVar2] == '\0') {
        uVar3 = (ulong)uVar4;
        uVar4 = uVar4 + 1;
        bsd->kmeans_texels[uVar3] = bVar2;
        acStack_f8[bVar2] = '\x01';
      }
    }
  }
  return;
}

Assistant:

static void assign_kmeans_texels(
	block_size_descriptor& bsd
) {
	// Use all texels for kmeans on a small block
	if (bsd.texel_count <= BLOCK_MAX_KMEANS_TEXELS)
	{
		for (uint8_t i = 0; i < bsd.texel_count; i++)
		{
			bsd.kmeans_texels[i] = i;
		}

		return;
	}

	// Select a random subset of BLOCK_MAX_KMEANS_TEXELS for kmeans on a large block
	uint64_t rng_state[2];
	astc::rand_init(rng_state);

	// Initialize array used for tracking used indices
	bool seen[BLOCK_MAX_TEXELS];
	for (uint8_t i = 0; i < bsd.texel_count; i++)
	{
		seen[i] = false;
	}

	// Assign 64 random indices, retrying if we see repeats
	unsigned int arr_elements_set = 0;
	while (arr_elements_set < BLOCK_MAX_KMEANS_TEXELS)
	{
		uint8_t texel = static_cast<uint8_t>(astc::rand(rng_state));
		texel = texel % bsd.texel_count;
		if (!seen[texel])
		{
			bsd.kmeans_texels[arr_elements_set++] = texel;
			seen[texel] = true;
		}
	}
}